

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O0

void EpdPow2Decimal(int n,EpDouble *epd)

{
  double dVar1;
  int n2;
  int n1;
  EpDouble epd2;
  EpDouble epd1;
  EpDouble *epd_local;
  int n_local;
  
  if (n < 0x400) {
    dVar1 = pow(2.0,(double)n);
    (epd->type).value = dVar1;
    epd->exponent = 0;
    EpdNormalizeDecimal(epd);
  }
  else {
    EpdPow2Decimal(n / 2,(EpDouble *)&epd2.exponent);
    EpdPow2Decimal(n - n / 2,(EpDouble *)&n2);
    EpdMultiply3Decimal((EpDouble *)&epd2.exponent,(EpDouble *)&n2,epd);
  }
  return;
}

Assistant:

void
EpdPow2Decimal(int n, EpDouble *epd)
{
  if (n <= EPD_MAX_BIN) {
    epd->type.value = pow((double)2.0, (double)n);
    epd->exponent = 0;
    EpdNormalizeDecimal(epd);
  } else {
    EpDouble    epd1, epd2;
    int         n1, n2;

    n1 = n / 2;
    n2 = n - n1;
    EpdPow2Decimal(n1, &epd1);
    EpdPow2Decimal(n2, &epd2);
    EpdMultiply3Decimal(&epd1, &epd2, epd);
  }
}